

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O2

void __thiscall
iu_ExpressionNotFail_x_iutest_x_Arithmetic_Test::Body
          (iu_ExpressionNotFail_x_iutest_x_Arithmetic_Test *this)

{
  ScopedSPITestFlag SVar1;
  TestFlag *pTVar2;
  char *in_R9;
  ScopedSPITestFlag guard_5;
  int local_2d8 [2];
  undefined1 local_2d0 [40];
  iuCodeMessage local_2a8;
  SPIFailureChecker iutest_failure_checker;
  AssertionResult iutest_ar;
  AssertionResult iutest_spi_ar;
  undefined1 local_1f0 [40];
  ScopedSPITestFlag guard;
  undefined4 uStack_1c4;
  bool local_1a8;
  int local_1a0 [2];
  Fixed local_198;
  
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  guard_5.super_ScopedGuard.m_test_flags = (ScopedGuard)0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_1f0,(int *)&guard_5)
  ;
  local_2d8[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator+<int>
            ((ExpressionLHS<int> *)local_2d0,(ExpressionLHS<int> *)local_1f0,local_2d8 + 1);
  local_2d8[0] = 0x2c;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_2a8,(ExpressionLHS<int> *)local_2d0,local_2d8);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_2a8,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)(local_2d0 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d0,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() + 2 == 44))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xd3,(char *)local_2d0._0_8_);
    local_2a8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2a8,&local_198);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 + 2 == 44",(allocator<char> *)&local_2a8);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xd3,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  guard_5.super_ScopedGuard.m_test_flags = (ScopedGuard)0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_1f0,(int *)&guard_5)
  ;
  local_2d8[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator-<int>
            ((ExpressionLHS<int> *)local_2d0,(ExpressionLHS<int> *)local_1f0,local_2d8 + 1);
  local_2d8[0] = 0x28;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_2a8,(ExpressionLHS<int> *)local_2d0,local_2d8);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_2a8,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)(local_2d0 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d0,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() - 2 == 40))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xd4,(char *)local_2d0._0_8_);
    local_2a8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2a8,&local_198);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 - 2 == 40",(allocator<char> *)&local_2a8);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xd4,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  guard_5.super_ScopedGuard.m_test_flags = (ScopedGuard)0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_1f0,(int *)&guard_5)
  ;
  local_2d8[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator*<int>
            ((ExpressionLHS<int> *)local_2d0,(ExpressionLHS<int> *)local_1f0,local_2d8 + 1);
  local_2d8[0] = 0x54;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_2a8,(ExpressionLHS<int> *)local_2d0,local_2d8);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_2a8,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)(local_2d0 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d0,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() * 2 == 84))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xd5,(char *)local_2d0._0_8_);
    local_2a8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2a8,&local_198);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 * 2 == 84",(allocator<char> *)&local_2a8);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xd5,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  guard_5.super_ScopedGuard.m_test_flags = (ScopedGuard)0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_1f0,(int *)&guard_5)
  ;
  local_2d8[1] = 2;
  iutest::detail::ExpressionLHS<int>::operator/<int>
            ((ExpressionLHS<int> *)local_2d0,(ExpressionLHS<int> *)local_1f0,local_2d8 + 1);
  local_2d8[0] = 0x15;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_2a8,(ExpressionLHS<int> *)local_2d0,local_2d8);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_2a8,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)(local_2d0 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d0,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() / 2 == 21))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xd6,(char *)local_2d0._0_8_);
    local_2a8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2a8,&local_198);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 / 2 == 21",(allocator<char> *)&local_2a8);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xd6,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  guard_5.super_ScopedGuard.m_test_flags = (ScopedGuard)0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS((ExpressionLHS<int> *)local_1f0,(int *)&guard_5)
  ;
  local_2d8[1] = 4;
  iutest::detail::ExpressionLHS<int>::operator%<int>
            ((ExpressionLHS<int> *)local_2d0,(ExpressionLHS<int> *)local_1f0,local_2d8 + 1);
  local_2d8[0] = 2;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_2a8,(ExpressionLHS<int> *)local_2d0,local_2d8);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_2a8,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)(local_2d0 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d0,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() % 4 == 2))","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xd7,(char *)local_2d0._0_8_);
    local_2a8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2a8,&local_198);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 % 4 == 2",(allocator<char> *)&local_2a8);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xd7,iutest_spi_ar.m_message._M_dataplus._M_p);
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard_5);
  local_2d8[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)&iutest_spi_ar,local_2d8 + 1);
  local_2d8[0] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator+<int>
            ((ExpressionLHS<int> *)local_1f0,(ExpressionLHS<int> *)&iutest_spi_ar,local_2d8);
  local_1a0[1] = 0x2a;
  iutest::detail::ExpressionLHS<int>::operator+<int>
            ((ExpressionLHS<int> *)local_2d0,(ExpressionLHS<int> *)local_1f0,local_1a0 + 1);
  local_1a0[0] = 0x7e;
  iutest::detail::ExpressionLHS<int>::operator==
            ((ExpressionResult *)&local_2a8,(ExpressionLHS<int> *)local_2d0,local_1a0);
  iutest::detail::ExpressionResult::GetResult
            ((AssertionResult *)&local_198,(ExpressionResult *)&local_2a8,false);
  iutest::AssertionResult::AssertionResult(&iutest_ar,(AssertionResult *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)(local_2d0 + 8));
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  std::__cxx11::string::~string((string *)&iutest_spi_ar.m_message._M_string_length);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              ((string *)local_2d0,(internal *)&iutest_ar,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f() + f() + f() == 126))"
               ,"false","true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_2a8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xd8,(char *)local_2d0._0_8_);
    local_2a8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_2a8,&local_198);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::__cxx11::string::~string((string *)local_2d0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  SVar1 = guard_5;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"expansion: 42 + 42 + 42 == 126",(allocator<char> *)&local_2a8);
  iutest::detail::SPIFailureChecker::GetResult
            ((AssertionResult *)&guard,&iutest_failure_checker,(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (local_1a8 == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&iutest_failure_checker,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
               ,0xd8,(char *)CONCAT44(uStack_1c4,guard.super_ScopedGuard.m_test_flags));
    iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>.m_results.
    super__Vector_base<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_failure_checker,&local_198);
    std::__cxx11::string::~string((string *)&iutest_failure_checker);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&guard);
  return;
}

Assistant:

IUTEST(ExpressionNotFail, Arithmetic)
{
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() + 2 == 44), "expansion: 42 + 2 == 44");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() - 2 == 40), "expansion: 42 - 2 == 40");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() * 2 == 84), "expansion: 42 * 2 == 84");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() / 2 == 21), "expansion: 42 / 2 == 21");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() % 4 == 2), "expansion: 42 % 4 == 2");
    CHECK_FATAL_FAILURE(IUTEST_ASSERT_NOT(f() + f() + f() == 126), "expansion: 42 + 42 + 42 == 126");
}